

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-test.c++
# Opt level: O3

String * __thiscall
capnp::compiler::anon_unknown_0::doLex<capnp::compiler::LexedTokens>
          (String *__return_storage_ptr__,anon_unknown_0 *this,StringPtr constText)

{
  size_t sVar1;
  Builder result;
  bool bVar2;
  int iVar3;
  char *c;
  char *pcVar4;
  String *extraout_RAX;
  undefined4 extraout_var;
  char *pcVar6;
  Builder *extraout_RDX;
  Builder *extraout_RDX_00;
  Builder *params;
  String *__range3;
  ArrayPtr<const_char> input;
  String text;
  TestFailingErrorReporter errorReporter;
  Builder file;
  MallocMessageBuilder message;
  String local_178;
  PointerBuilder local_158;
  StructBuilder local_140;
  Builder local_118;
  MallocMessageBuilder local_100;
  String *pSVar5;
  
  kj::heapString(&local_178,(char *)this,(size_t)(constText.content.ptr + -1));
  pcVar6 = local_178.content.ptr + -1 + local_178.content.size_;
  pcVar4 = local_178.content.ptr;
  if ((char *)local_178.content.size_ == (char *)0x0) {
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  for (; pcVar4 != pcVar6; pcVar4 = pcVar4 + 1) {
    if (*pcVar4 == '\'') {
      *pcVar4 = '\"';
    }
  }
  MallocMessageBuilder::MallocMessageBuilder(&local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_118,&local_100.super_MessageBuilder);
  local_158.pointer = local_118.builder.pointer;
  local_158.segment = local_118.builder.segment;
  local_158.capTable = local_118.builder.capTable;
  capnp::_::PointerBuilder::initStruct(&local_140,&local_158,(StructSize)0x10000);
  local_158.segment = (SegmentBuilder *)&PTR_addError_00611488;
  pcVar6 = (char *)local_178.content.size_;
  if ((char *)local_178.content.size_ != (char *)0x0) {
    pcVar6 = local_178.content.ptr;
  }
  pcVar4 = (char *)0x0;
  if ((char *)local_178.content.size_ != (char *)0x0) {
    pcVar4 = (char *)(local_178.content.size_ + -1);
  }
  result._builder.capTable = local_140.capTable;
  result._builder.segment = local_140.segment;
  result._builder.data = local_140.data;
  result._builder.pointers = local_140.pointers;
  result._builder.dataSize = local_140.dataSize;
  result._builder.pointerCount = local_140.pointerCount;
  result._builder._38_2_ = local_140._38_2_;
  input.size_ = (size_t)pcVar4;
  input.ptr = pcVar6;
  bVar2 = lex(input,result,(ErrorReporter *)&local_158);
  params = extraout_RDX;
  if (!bVar2 && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/lexer-test.c++"
               ,0x3d,ERROR,"\"failed: expected \" \"lex(text, file, errorReporter)\"",
               (char (*) [48])"failed: expected lex(text, file, errorReporter)");
    params = extraout_RDX_00;
  }
  kj::str<capnp::compiler::LexedTokens::Builder&>(__return_storage_ptr__,(kj *)&local_140,params);
  pcVar4 = (__return_storage_ptr__->content).ptr;
  sVar1 = (__return_storage_ptr__->content).size_;
  pcVar6 = pcVar4 + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar4 = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  for (; pcVar4 != pcVar6; pcVar4 = pcVar4 + 1) {
    if (*pcVar4 == '\"') {
      *pcVar4 = '\'';
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_100);
  sVar1 = local_178.content.size_;
  pcVar6 = local_178.content.ptr;
  pSVar5 = extraout_RAX;
  if (local_178.content.ptr != (char *)0x0) {
    local_178.content.ptr = (char *)0x0;
    local_178.content.size_ = 0;
    iVar3 = (**(local_178.content.disposer)->_vptr_ArrayDisposer)
                      (local_178.content.disposer,pcVar6,1,sVar1,sVar1,0);
    pSVar5 = (String *)CONCAT44(extraout_var,iVar3);
  }
  return pSVar5;
}

Assistant:

kj::String doLex(kj::StringPtr constText) {
  // Parse the given string into the given Cap'n Proto struct type using lex(), then stringify the
  // result and return that string.  Additionally, single quotes in the input are converted to
  // double quotes, and double quotes in the output are converted to single quotes, to reduce the
  // amount of escaping needed in the test strings.
  //
  // Comparing stringifications against golden strings is ugly and brittle.  If we had a
  // text-format parser we could use that.  Except that said parser would probably be built on
  // the very lexer being tested here, so...  maybe this is the best we can reasonably do.

  kj::String text = heapString(constText);
  for (char& c: text) {
    // Make it easier to write input strings below.
    if (c == '\'') c = '\"';
  }
  MallocMessageBuilder message;
  auto file = message.initRoot<LexResult>();
  TestFailingErrorReporter errorReporter;
  EXPECT_TRUE(lex(text, file, errorReporter));
  kj::String result = kj::str(file);
  for (char& c: result) {
    // Make it easier to write golden strings below.
    if (c == '\"') c = '\'';
  }
  return result;
}